

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O0

void init_protos(void)

{
  Am_Slot_Key AVar1;
  ushort uVar2;
  ushort uVar3;
  ulong uVar4;
  Am_Constraint *pAVar5;
  Am_Object *pAVar6;
  Am_Wrapper *pAVar7;
  undefined1 auVar8 [12];
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Image_Array local_38 [8];
  char *local_30;
  char *klingon_image_file;
  undefined8 local_20;
  Am_Image_Array local_18 [8];
  char *local_10;
  char *federation_image_file;
  
  local_10 = (char *)Am_Merge_Pathname("images/ent.gif");
  Am_Image_Array::Am_Image_Array(local_18,local_10);
  Am_Image_Array::operator=((Am_Image_Array *)&SP_Federation_Image,local_18);
  Am_Image_Array::~Am_Image_Array(local_18);
  if (local_10 != (char *)0x0) {
    operator_delete__(local_10);
  }
  uVar4 = Am_Image_Array::Valid();
  if ((uVar4 & 1) == 0) {
    auVar8 = Am_Error("Federation image not found");
    klingon_image_file._4_4_ = auVar8._8_4_;
    local_20 = auVar8._0_8_;
    Am_Image_Array::~Am_Image_Array(local_18);
  }
  else {
    local_30 = (char *)Am_Merge_Pathname("images/kling.gif");
    Am_Image_Array::Am_Image_Array(local_38,local_30);
    Am_Image_Array::operator=((Am_Image_Array *)&SP_Klingon_Image,local_38);
    Am_Image_Array::~Am_Image_Array(local_38);
    if (local_30 != (char *)0x0) {
      operator_delete__(local_30);
    }
    uVar4 = Am_Image_Array::Valid();
    if ((uVar4 & 1) != 0) {
      Am_Object::Create((char *)&local_40);
      uVar2 = Am_Object::Add((ushort)&local_40,(uint)SHIP_TYPE,2);
      pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Width_Of_Parts);
      uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x66,(ulong)pAVar5);
      pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Height_Of_Parts);
      uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x67,(ulong)pAVar5);
      AVar1 = SHIP_BITMAP;
      Am_Object::Create((char *)&local_50);
      uVar3 = Am_Object::Set((ushort)&local_50,100,0);
      uVar3 = Am_Object::Set(uVar3,0x65,0);
      pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)ship_image);
      uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0xb0,(ulong)pAVar5);
      pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)ship_color);
      uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x6b,(ulong)pAVar5);
      pAVar6 = (Am_Object *)Am_Object::Set(uVar3,true,1);
      Am_Object::Am_Object(&local_48,pAVar6);
      uVar2 = Am_Object::Add_Part(uVar2,(Am_Object *)(ulong)AVar1,(ulong)&local_48);
      AVar1 = SHIP_LABEL;
      Am_Object::Create((char *)&local_60);
      pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)ship_label_left);
      uVar3 = Am_Object::Set((ushort)&local_60,(Am_Constraint *)0x64,(ulong)pAVar5);
      pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)ship_label_top);
      uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x65,(ulong)pAVar5);
      uVar3 = Am_Object::Set(uVar3,(char *)0xab,0x10e484);
      pAVar7 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White);
      pAVar6 = (Am_Object *)Am_Object::Set(uVar3,(Am_Wrapper *)0x6b,(ulong)pAVar7);
      Am_Object::Am_Object(&local_58,pAVar6);
      pAVar6 = (Am_Object *)Am_Object::Add_Part(uVar2,(Am_Object *)(ulong)AVar1,(ulong)&local_58);
      Am_Object::operator=(&SP_Ship,pAVar6);
      Am_Object::~Am_Object(&local_58);
      Am_Object::~Am_Object(&local_60);
      Am_Object::~Am_Object(&local_48);
      Am_Object::~Am_Object(&local_50);
      Am_Object::~Am_Object(&local_40);
      Am_Object::Create((char *)&local_68);
      uVar2 = Am_Object::Set((ushort)&local_68,true,0);
      pAVar7 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&SP_Tractor_Beam_Style);
      pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6b,(ulong)pAVar7);
      Am_Object::operator=(&SP_Tractor_Beam,pAVar6);
      Am_Object::~Am_Object(&local_68);
      Am_Object::Am_Object(&local_70,(Am_Object *)&SP_Tractor_Beam);
      Am_Object::Add_Part((Am_Object *)&SP_Clip_Win,SUB81(&local_70,0),1);
      Am_Object::~Am_Object(&local_70);
      return;
    }
    auVar8 = Am_Error("Klingon image not found");
    klingon_image_file._4_4_ = auVar8._8_4_;
    local_20 = auVar8._0_8_;
    Am_Image_Array::~Am_Image_Array(local_38);
  }
  _Unwind_Resume(local_20);
}

Assistant:

void
init_protos()
{

  const char *federation_image_file = Am_Merge_Pathname(IMFN_FEDERATION);
  SP_Federation_Image = Am_Image_Array(federation_image_file);
  delete[] federation_image_file;
  if (!SP_Federation_Image.Valid())
    Am_Error("Federation image not found");

  const char *klingon_image_file = Am_Merge_Pathname(IMFN_KLINGON);
  SP_Klingon_Image = Am_Image_Array(klingon_image_file);
  delete[] klingon_image_file;
  if (!SP_Klingon_Image.Valid())
    Am_Error("Klingon image not found");

  SP_Ship = Am_Group.Create("SP_Ship")
                .Add(SHIP_TYPE, KLINGON) // Set in instances of SP_Ship
                .Set(Am_WIDTH, Am_Width_Of_Parts)
                .Set(Am_HEIGHT, Am_Height_Of_Parts)
                .Add_Part(SHIP_BITMAP, Am_Bitmap.Create("SP_Ship_Bitmap")
                                           .Set(Am_LEFT, 0)
                                           .Set(Am_TOP, 0)
                                           .Set(Am_IMAGE, (ship_image))
                                           .Set(Am_LINE_STYLE, (ship_color))
                                           .Set(Am_DRAW_MONOCHROME, true))
                .Add_Part(SHIP_LABEL, Am_Text.Create("SP_Ship_Label")
                                          .Set(Am_LEFT, (ship_label_left))
                                          .Set(Am_TOP, (ship_label_top))
                                          .Set(Am_TEXT, "Label")
                                          .Set(Am_LINE_STYLE, Am_White));

  SP_Tractor_Beam = Am_Line.Create("SP_Tractor_Beam")
                        .Set(Am_VISIBLE, false) // Set by interactor
                        .Set(Am_LINE_STYLE, SP_Tractor_Beam_Style);
  SP_Clip_Win.Add_Part(SP_Tractor_Beam);
}